

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::GetSafetyRelayStatus(AmpIO *this)

{
  uint32_t uVar1;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x44514c41) {
    this_local._7_1_ = GetSafetyRelay(this);
  }
  else {
    uVar1 = GetStatus(this);
    this_local._7_1_ = (uVar1 & 0x20000) != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::GetSafetyRelayStatus(void) const
{
    // DQLA does not have this feedback (uses LEDs instead),
    // so we just return true if the relay should be on.
    if (GetHardwareVersion() == DQLA_String)
        return GetSafetyRelay();

    // Bit 17
    return (GetStatus() & RELAY_FB);
}